

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmGeneratorTarget *pcVar4;
  cmLocalUnixMakefileGenerator3 *lg;
  cmMakefile *pcVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  string *psVar9;
  long *plVar10;
  size_type *psVar11;
  cmOutputConverter *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string targetOutput;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string buildEcho;
  EchoProgress local_128;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  
  pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  lg = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_128.Dir,&this->super_cmMakefileTargetGenerator);
  bVar7 = requireDeviceLinking(pcVar4,(cmLocalGenerator *)lg,&local_128.Dir);
  paVar2 = &local_128.Dir.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.Dir._M_dataplus._M_p != paVar2) {
    operator_delete(local_128.Dir._M_dataplus._M_p,
                    CONCAT71(local_128.Dir.field_2._M_allocated_capacity._1_7_,
                             local_128.Dir.field_2._M_local_buf[0]) + 1);
  }
  if (bVar7) {
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_128.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"CMAKE_CUDA_OUTPUT_EXTENSION","");
    psVar9 = cmMakefile::GetSafeDefinition(pcVar5,&local_128.Dir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_128.Dir._M_dataplus._M_p,
                      CONCAT71(local_128.Dir.field_2._M_allocated_capacity._1_7_,
                               local_128.Dir.field_2._M_local_buf[0]) + 1);
    }
    pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar6 = (pcVar4->ObjectDirectory)._M_dataplus._M_p;
    local_128.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar6,pcVar6 + (pcVar4->ObjectDirectory)._M_string_length);
    std::__cxx11::string::append((char *)&local_128);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_128,(ulong)(psVar9->_M_dataplus)._M_p);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8.field_2._8_8_ = plVar10[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar11;
      local_e8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_e8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_128.Dir._M_dataplus._M_p,
                      CONCAT71(local_128.Dir.field_2._M_allocated_capacity._1_7_,
                               local_128.Dir.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
    puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
    *puVar1 = *puVar1 + 1;
    if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
      paVar3 = &local_128.Arg.field_2;
      local_128.Dir._M_string_length = 0;
      local_128.Dir.field_2._M_local_buf[0] = '\0';
      local_128.Arg._M_string_length = 0;
      local_128.Arg.field_2._M_local_buf[0] = '\0';
      local_128.Dir._M_dataplus._M_p = (pointer)paVar2;
      local_128.Arg._M_dataplus._M_p = (pointer)paVar3;
      cmMakefileTargetGenerator::MakeEchoProgress(&this->super_cmMakefileTargetGenerator,&local_128)
      ;
      this_00 = &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                 super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      cmOutputConverter::MaybeRelativeToCurBinDir(&local_b0,this_00,&this->DeviceLinkObject);
      source._M_str = local_b0._M_dataplus._M_p;
      source._M_len = local_b0._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_90,this_00,source,SHELL);
      local_50._M_len = 0x19;
      local_50._M_str = "Linking CUDA device code ";
      local_40 = local_90._M_string_length;
      local_38 = local_90._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = &local_50;
      cmCatViews_abi_cxx11_(&local_70,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::AppendEcho
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,&local_c8,&local_70,EchoLink
                 ,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.Arg._M_dataplus._M_p != paVar3) {
        operator_delete(local_128.Arg._M_dataplus._M_p,
                        CONCAT71(local_128.Arg.field_2._M_allocated_capacity._1_7_,
                                 local_128.Arg.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.Dir._M_dataplus._M_p != paVar2) {
        operator_delete(local_128.Dir._M_dataplus._M_p,
                        CONCAT71(local_128.Dir.field_2._M_allocated_capacity._1_7_,
                                 local_128.Dir.field_2._M_local_buf[0]) + 1);
      }
    }
    pcVar5 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_128.Dir._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"CMAKE_CUDA_COMPILER_ID","");
    psVar9 = cmMakefile::GetSafeDefinition(pcVar5,&local_128.Dir);
    iVar8 = std::__cxx11::string::compare((char *)psVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.Dir._M_dataplus._M_p != paVar2) {
      operator_delete(local_128.Dir._M_dataplus._M_p,
                      CONCAT71(local_128.Dir.field_2._M_allocated_capacity._1_7_,
                               local_128.Dir.field_2._M_local_buf[0]) + 1);
    }
    if (iVar8 == 0) {
      cmMakefileTargetGenerator::WriteDeviceLinkRule
                (&this->super_cmMakefileTargetGenerator,&local_c8,&local_e8);
    }
    else {
      (*(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
        _vptr_cmCommonTargetGenerator[8])(this,(ulong)relink,&local_c8,&local_e8);
    }
    cmMakefileTargetGenerator::WriteTargetDriverRule
              (&this->super_cmMakefileTargetGenerator,&local_e8,relink);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifndef CMAKE_BOOTSTRAP
  const bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
  if (!requiresDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the name of the device object to generate.
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");
  std::string const targetOutput =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutput;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = cmStrCat(
      "Linking CUDA device code ",
      this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToCurBinDir(this->DeviceLinkObject),
        cmOutputConverter::SHELL));
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  if (this->Makefile->GetSafeDefinition("CMAKE_CUDA_COMPILER_ID") == "Clang") {
    this->WriteDeviceLinkRule(commands, targetOutput);
  } else {
    this->WriteNvidiaDeviceExecutableRule(relink, commands, targetOutput);
  }

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutput, relink);
#else
  static_cast<void>(relink);
#endif
}